

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Filter * __thiscall
helics::ConnectorFederateManager::registerFilter
          (ConnectorFederateManager *this,string_view name,string_view type_in,string_view type_out)

{
  InterfaceHandle ihandle;
  int iVar1;
  Filter *this_00;
  undefined4 extraout_var;
  RegistrationFailure *this_01;
  char *pcVar2;
  size_t sVar3;
  string_view searchValue;
  string_view message;
  handle filts;
  _Head_base<0UL,_helics::Filter_*,_false> local_50;
  handle local_48;
  
  pcVar2 = name._M_str;
  sVar3 = name._M_len;
  ihandle.hid = (*this->coreObject->_vptr_Core[0x3b])();
  if (ihandle.hid != -1700000000) {
    this_00 = (Filter *)operator_new(0x50);
    Filter::Filter(this_00,this->fed,name,ihandle);
    local_50._M_head_impl = this_00;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_48,&this->filters);
    if (sVar3 == 0) {
      iVar1 = (*this->coreObject->_vptr_Core[0x28])
                        (this->coreObject,(ulong)(uint)(this_00->super_Interface).handle.hid);
      pcVar2 = *(char **)CONCAT44(extraout_var,iVar1);
      sVar3 = ((undefined8 *)CONCAT44(extraout_var,iVar1))[1];
    }
    searchValue._M_str = pcVar2;
    searchValue._M_len = sVar3;
    gmlc::containers::
    StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
    ::insert<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
              ((StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
                *)local_48.data,searchValue,
               (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)&local_50);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
    if (local_50._M_head_impl != (Filter *)0x0) {
      (*((local_50._M_head_impl)->super_Interface)._vptr_Interface[1])();
    }
    return this_00;
  }
  this_01 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Filter";
  message._M_len = 0x19;
  RegistrationFailure::RegistrationFailure(this_01,message);
  __cxa_throw(this_01,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Filter& ConnectorFederateManager::registerFilter(std::string_view name,
                                                 std::string_view type_in,
                                                 std::string_view type_out)
{
    auto handle = coreObject->registerFilter(name, type_in, type_out);
    if (handle.isValid()) {
        auto filtPtr = std::make_unique<Filter>(fed, name, handle);
        Filter& filt = *filtPtr;
        auto filts = filters.lock();
        if (name.empty()) {
            filts->insert(coreObject->getHandleName(filtPtr->getHandle()), std::move(filtPtr));
        } else {
            filts->insert(name, std::move(filtPtr));
        }
        return filt;
    }
    throw(RegistrationFailure("Unable to register Filter"));
}